

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::insert
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,size_t index,utf32_t x,
          size_t count)

{
  C *pCVar1;
  C *p;
  C *pattern_00;
  long in_RCX;
  size_t in_RDI;
  C *dst;
  size_t insertLength;
  size_t codePointLength;
  C *end;
  C pattern [4];
  size_t oldLength;
  C *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa8;
  undefined1 local_34 [4];
  C *local_30;
  long local_28;
  C *local_8;
  
  local_30 = *(C **)(in_RDI + 0x10);
  local_8 = local_30;
  if (in_RCX != 0) {
    local_28 = in_RCX;
    pCVar1 = enc::Utf8Encoder::encode(in_stack_ffffffffffffff98,0,0x1307c4);
    p = (C *)(local_28 * (long)(pCVar1 + -(long)local_34));
    pattern_00 = insertSpace((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                             (pCVar1 + -(long)local_34),(size_t)p,in_stack_ffffffffffffffa8);
    if (pattern_00 == (C *)0x0) {
      local_8 = (C *)0xffffffffffffffff;
    }
    else {
      fillWithPattern(p,pattern_00,in_RDI,(size_t)in_stack_ffffffffffffff98);
      local_8 = local_30 + (long)p;
    }
  }
  return (size_t)local_8;
}

Assistant:

size_t
	insert(
		size_t index,
		utf32_t x,
		size_t count
	) {
		size_t oldLength = this->m_length;

		if (count == 0)
			return oldLength;

		C pattern[sizeof(utf32_t) / sizeof(C)];
		C* end = Encoding::Encoder::encode(pattern, x);
		size_t codePointLength = end - pattern;
		ASSERT(codePointLength <= countof(pattern));

		size_t insertLength = count * codePointLength;
		C* dst = insertSpace(index, count * codePointLength);
		if (!dst)
			return -1;

		fillWithPattern(dst, pattern, codePointLength, count);
		return oldLength + insertLength;
	}